

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O0

Pln_Man_t * Pln_ManAlloc(Gia_Man_t *pGia,Vec_Int_t *vOrder)

{
  int iVar1;
  int iVar2;
  Pln_Man_t *pPVar3;
  Hsh_VecMan_t *pHVar4;
  Vec_Que_t *pVVar5;
  Vec_Flt_t *pVVar6;
  Vec_Int_t *pVVar7;
  float **pCosts;
  Vec_Int_t *local_28;
  Pln_Man_t *p;
  Vec_Int_t *vOrder_local;
  Gia_Man_t *pGia_local;
  
  pPVar3 = (Pln_Man_t *)calloc(1,0x70);
  pPVar3->pGia = pGia;
  pHVar4 = Hsh_VecManStart(1000);
  pPVar3->pHashC = pHVar4;
  pHVar4 = Hsh_VecManStart(1000);
  pPVar3->pHashM = pHVar4;
  pVVar5 = Vec_QueAlloc(1000);
  pPVar3->vQue = pVVar5;
  pVVar6 = Vec_FltAlloc(1000);
  pPVar3->vCounts = pVVar6;
  pVVar7 = Vec_IntAlloc(1000);
  pPVar3->vCoefs = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pPVar3->vTempC[0] = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pPVar3->vTempC[1] = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pPVar3->vTempM[0] = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pPVar3->vTempM[1] = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pPVar3->vTempM[2] = pVVar7;
  pVVar7 = Vec_IntAlloc(100);
  pPVar3->vTempM[3] = pVVar7;
  if (vOrder == (Vec_Int_t *)0x0) {
    iVar1 = Gia_ManObjNum(pGia);
    local_28 = Vec_IntStartNatural(iVar1);
  }
  else {
    local_28 = Vec_IntDup(vOrder);
  }
  pPVar3->vOrder = local_28;
  iVar1 = Vec_IntSize(pPVar3->vOrder);
  iVar2 = Gia_ManObjNum(pGia);
  if (iVar1 == iVar2) {
    pVVar5 = pPVar3->vQue;
    pCosts = Vec_FltArrayP(pPVar3->vCounts);
    Vec_QueSetPriority(pVVar5,pCosts);
    Hsh_VecManAdd(pPVar3->pHashC,pPVar3->vTempC[0]);
    Hsh_VecManAdd(pPVar3->pHashM,pPVar3->vTempM[0]);
    Vec_FltPush(pPVar3->vCounts,0.0);
    Vec_IntPush(pPVar3->vCoefs,0);
    return pPVar3;
  }
  __assert_fail("Vec_IntSize(p->vOrder) == Gia_ManObjNum(pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecPolyn.c"
                ,0x5c,"Pln_Man_t *Pln_ManAlloc(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Pln_Man_t * Pln_ManAlloc( Gia_Man_t * pGia, Vec_Int_t * vOrder )
{
    Pln_Man_t * p = ABC_CALLOC( Pln_Man_t, 1 );
    p->pGia      = pGia;
    p->pHashC    = Hsh_VecManStart( 1000 );
    p->pHashM    = Hsh_VecManStart( 1000 );
    p->vQue      = Vec_QueAlloc( 1000 );
    p->vCounts   = Vec_FltAlloc( 1000 );
    p->vCoefs    = Vec_IntAlloc( 1000 );
    p->vTempC[0] = Vec_IntAlloc( 100 );
    p->vTempC[1] = Vec_IntAlloc( 100 );
    p->vTempM[0] = Vec_IntAlloc( 100 );
    p->vTempM[1] = Vec_IntAlloc( 100 );
    p->vTempM[2] = Vec_IntAlloc( 100 );
    p->vTempM[3] = Vec_IntAlloc( 100 );
    p->vOrder    = vOrder ? Vec_IntDup(vOrder) : Vec_IntStartNatural( Gia_ManObjNum(pGia) );
    assert( Vec_IntSize(p->vOrder) == Gia_ManObjNum(pGia) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // add 0-constant and 1-monomial
    Hsh_VecManAdd( p->pHashC, p->vTempC[0] );
    Hsh_VecManAdd( p->pHashM, p->vTempM[0] );
    Vec_FltPush( p->vCounts, 0 );
    Vec_IntPush( p->vCoefs, 0 );
    return p;
}